

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

bool __thiscall ON_Font::SetWindowsLogfontName(ON_Font *this,wchar_t *windows_logfont_name)

{
  bool bVar1;
  ON_FontList *this_00;
  ON_Font *src;
  wchar_t *string2;
  undefined1 local_40 [8];
  ON_wString family_name;
  uchar logfont_charset;
  ON_Font *installed_font;
  Stretch font_stretch;
  Style font_style;
  Weight font_weight;
  wchar_t *windows_logfont_name_local;
  ON_Font *this_local;
  
  bVar1 = IsValidFaceName(windows_logfont_name);
  if (bVar1) {
    this_00 = InstalledFontList();
    src = ON_FontList::FromNames
                    (this_00,(wchar_t *)0x0,windows_logfont_name,(wchar_t *)0x0,(wchar_t *)0x0,
                     Normal,Medium,Upright,false,false);
    if (src == (ON_Font *)0x0) {
      family_name.m_s._7_1_ = WindowsLogfontCharSetFromFaceName(windows_logfont_name);
      FamilyNameFromDirtyName((ON_Font *)local_40,windows_logfont_name);
      string2 = ON_wString::operator_cast_to_wchar_t_(&this->m_loc_windows_logfont_name);
      bVar1 = ON_wString::EqualOrdinal(windows_logfont_name,string2,false);
      if (((((bVar1) &&
            (bVar1 = ::operator==((ON_wString *)local_40,&this->m_loc_family_name), bVar1)) &&
           (this->m_font_weight == Normal)) &&
          ((this->m_font_style == Upright && (this->m_font_stretch == Medium)))) &&
         ((family_name.m_s._7_1_ == this->m_logfont_charset && (this->m_font_origin == Unknown)))) {
        this_local._7_1_ = 1;
        bVar1 = true;
      }
      else {
        bVar1 = ModificationPermitted
                          (this,"",
                           "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
                           ,0x2d45);
        if (bVar1) {
          bVar1 = ON_wString::EqualOrdinal(L"Arial",windows_logfont_name,true);
          if (bVar1) {
            ON_wString::operator=(&this->m_loc_postscript_name,L"ArialMT");
          }
          else {
            bVar1 = ON_wString::EqualOrdinal(L"Segoe UI",windows_logfont_name,true);
            if ((bVar1) ||
               (bVar1 = ON_wString::EqualOrdinal(L"SegoeUI",windows_logfont_name,true), bVar1)) {
              ON_wString::operator=(&this->m_loc_postscript_name,L"SegoeUI");
            }
            else {
              bVar1 = ON_wString::EqualOrdinal(L"Helvetica Neue",windows_logfont_name,true);
              if ((bVar1) ||
                 (bVar1 = ON_wString::EqualOrdinal(L"HelveticaNeue",windows_logfont_name,true),
                 bVar1)) {
                ON_wString::operator=(&this->m_loc_postscript_name,L"HelveticaNeue");
              }
              else {
                bVar1 = ON_wString::EqualOrdinal(L"Helvetica",windows_logfont_name,true);
                if (bVar1) {
                  ON_wString::operator=(&this->m_loc_postscript_name,L"Helvetica");
                }
                else {
                  ON_wString::operator=(&this->m_loc_postscript_name,&ON_wString::EmptyString);
                }
              }
            }
          }
          ON_wString::operator=(&this->m_en_postscript_name,&this->m_loc_postscript_name);
          ON_wString::operator=(&this->m_loc_family_name,(ON_wString *)local_40);
          ON_wString::operator=(&this->m_en_family_name,&this->m_loc_family_name);
          ON_wString::operator=(&this->m_loc_windows_logfont_name,windows_logfont_name);
          ON_wString::operator=(&this->m_en_windows_logfont_name,&this->m_loc_windows_logfont_name);
          this->m_logfont_charset = family_name.m_s._7_1_;
          this->m_font_weight = Normal;
          this->m_font_style = Upright;
          this->m_font_stretch = Medium;
          this->m_font_origin = Unknown;
          bVar1 = false;
        }
        else {
          this_local._7_1_ = 0;
          bVar1 = true;
        }
      }
      ON_wString::~ON_wString((ON_wString *)local_40);
      if (bVar1) goto LAB_0063b16f;
    }
    else {
      operator=(this,src);
    }
    Internal_AfterModification(this);
    this_local._7_1_ = 1;
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_0063b16f:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ON_Font::SetWindowsLogfontName(
  const wchar_t* windows_logfont_name
  )
{
  if (false == ON_Font::IsValidFaceName(windows_logfont_name))
    return false;

  const ON_Font::Weight font_weight = ON_Font::Weight::Normal;
  const ON_Font::Style font_style = ON_Font::Style::Upright;
  const ON_Font::Stretch font_stretch = ON_Font::Stretch::Medium;

  const ON_Font* installed_font =
    ON_Font::InstalledFontList().FromNames(
      nullptr,
      windows_logfont_name,
      nullptr,
      nullptr,
      font_weight,
      font_stretch,
      font_style,
      false,
      false
    );

  if (nullptr != installed_font)
  {
    *this = *installed_font;
  }
  else
  {
    const unsigned char logfont_charset = ON_Font::WindowsLogfontCharSetFromFaceName(windows_logfont_name);

    const ON_wString family_name = ON_Font::FamilyNameFromDirtyName(windows_logfont_name);

    if (
      ON_wString::EqualOrdinal(windows_logfont_name, m_loc_windows_logfont_name, false)
      && family_name == m_loc_family_name
      && font_weight == m_font_weight
      && font_style == m_font_style
      && font_stretch == m_font_stretch
      && logfont_charset == m_logfont_charset
      && ON_Font::Origin::Unknown == m_font_origin
      )
    {
      return true;
    }

    if (false == ON_FONT_MODIFICATION_PERMITTED)
      return false;

    // TODO - better support for generating PostScript names from LOGFONT.lfFaceNames
    //  This code at least handles the 4 most common names passed to this setter.
    if (ON_wString::EqualOrdinal(L"Arial", windows_logfont_name, true))
      m_loc_postscript_name = L"ArialMT";
    else if (ON_wString::EqualOrdinal(L"Segoe UI", windows_logfont_name, true)
      || ON_wString::EqualOrdinal(L"SegoeUI", windows_logfont_name, true))
    {
      m_loc_postscript_name = L"SegoeUI";
    }
    else if (ON_wString::EqualOrdinal(L"Helvetica Neue", windows_logfont_name, true)
      || ON_wString::EqualOrdinal(L"HelveticaNeue", windows_logfont_name, true))
      m_loc_postscript_name = L"HelveticaNeue";
    else if (ON_wString::EqualOrdinal(L"Helvetica", windows_logfont_name, true))
      m_loc_postscript_name = L"Helvetica";
    else
      m_loc_postscript_name = ON_wString::EmptyString;

    m_en_postscript_name = m_loc_postscript_name;

    m_loc_family_name = family_name;
    m_en_family_name = m_loc_family_name;

    m_loc_windows_logfont_name = windows_logfont_name;
    m_en_windows_logfont_name = m_loc_windows_logfont_name;

    m_logfont_charset = logfont_charset;
    m_font_weight = font_weight;
    m_font_style = font_style;
    m_font_stretch = font_stretch;
    m_font_origin = ON_Font::Origin::Unknown;
  }
  
  Internal_AfterModification();

  return true;
}